

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall
Am_Value_List_Data::Make_Unique
          (Am_Value_List_Data *this,Am_Value_List_Data **data,Am_List_Item **current)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *local_38;
  Am_List_Item *old_current;
  Am_List_Item *new_current;
  Am_Value_List_Data *new_data;
  Am_List_Item **current_local;
  Am_Value_List_Data **data_local;
  Am_Value_List_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  if (!bVar1) {
    iVar2 = (*((*data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    if (*current != (Am_List_Item *)0x0) {
      old_current = ((Am_Value_List_Data *)CONCAT44(extraout_var,iVar2))->head;
      for (local_38 = (*current)->prev; local_38 != (Am_List_Item *)0x0; local_38 = local_38->prev)
      {
        old_current = old_current->next;
      }
      *current = old_current;
    }
    *data = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void
Am_Value_List_Data::Make_Unique(Am_Value_List_Data *&data,
                                Am_List_Item *&current)
{
  if (!Is_Unique()) {
    Am_Value_List_Data *new_data = (Am_Value_List_Data *)data->Make_Unique();
    if (current) {
      Am_List_Item *new_current = new_data->head;
      Am_List_Item *old_current = current->prev;
      while (old_current) {
        old_current = old_current->prev;
        new_current = new_current->next;
      }
      current = new_current;
    }
    data = new_data;
  }
}